

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

QSize __thiscall QCss::ValueExtractor::sizeValue(ValueExtractor *this,Declaration *decl)

{
  bool bVar1;
  int iVar2;
  DeclarationData *pDVar3;
  qsizetype qVar4;
  QFont *f;
  long in_FS_OFFSET;
  LengthData LVar5;
  QList<QVariant> v;
  QList<QVariant> v_1;
  LengthData x [2];
  int in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  QSize *in_stack_fffffffffffffed0;
  QFont *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  Value *in_stack_ffffffffffffff00;
  ValueExtractor *in_stack_ffffffffffffff08;
  undefined4 uStack_dc;
  undefined4 uStack_cc;
  QSize local_90;
  QVariant local_88;
  QVariant local_68;
  QVariant local_48;
  qreal local_28;
  undefined8 local_20;
  qreal local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2ebda);
  bVar1 = ::QVariant::isValid((QVariant *)in_stack_fffffffffffffed0);
  if (bVar1) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2ec26);
    ::QVariant::toList();
    QList<QVariant>::at((QList<QVariant> *)in_stack_fffffffffffffed0,
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    qvariant_cast<QCss::LengthData>
              ((QVariant *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    iVar2 = lengthValueFromData((LengthData *)
                                CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                in_stack_fffffffffffffed8);
    QList<QVariant>::at((QList<QVariant> *)in_stack_fffffffffffffed0,
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    qvariant_cast<QCss::LengthData>((QVariant *)CONCAT44(iVar2,in_stack_fffffffffffffee0));
    lengthValueFromData((LengthData *)CONCAT44(iVar2,in_stack_fffffffffffffee0),
                        in_stack_fffffffffffffed8);
    QSize::QSize(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
    QList<QVariant>::~QList((QList<QVariant> *)0xa2ecd4);
  }
  else {
    memset(&local_28,0,0x20);
    pDVar3 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                       ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2ecf7
                       );
    qVar4 = QList<QCss::Value>::size(&pDVar3->values);
    if (0 < qVar4) {
      QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2ed13);
      QList<QCss::Value>::at
                ((QList<QCss::Value> *)in_stack_fffffffffffffed0,
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      LVar5 = lengthValue(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      local_28 = LVar5.number;
      local_20 = CONCAT44(uStack_cc,LVar5.unit);
    }
    pDVar3 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                       ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2ed5e
                       );
    qVar4 = QList<QCss::Value>::size(&pDVar3->values);
    if (qVar4 < 2) {
      local_18 = local_28;
      local_10 = local_20;
    }
    else {
      QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2ed7a);
      QList<QCss::Value>::at
                ((QList<QCss::Value> *)in_stack_fffffffffffffed0,
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      LVar5 = lengthValue(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      local_18 = LVar5.number;
      local_10 = CONCAT44(uStack_dc,LVar5.unit);
    }
    QList<QVariant>::QList((QList<QVariant> *)0xa2ee0c);
    ::QVariant::fromValue<QCss::LengthData>((LengthData *)in_stack_fffffffffffffed8);
    f = (QFont *)QList<QVariant>::operator<<
                           ((QList<QVariant> *)in_stack_fffffffffffffed0,
                            (rvalue_ref)
                            CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    ::QVariant::fromValue<QCss::LengthData>((LengthData *)f);
    QList<QVariant>::operator<<
              ((QList<QVariant> *)in_stack_fffffffffffffed0,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    ::QVariant::~QVariant(&local_68);
    ::QVariant::~QVariant(&local_48);
    ::QVariant::QVariant(&local_88,(QList_conflict3 *)&stack0xffffffffffffff00);
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2ee99);
    ::QVariant::operator=((QVariant *)f,(QVariant *)in_stack_fffffffffffffed0);
    ::QVariant::~QVariant(&local_88);
    iVar2 = lengthValueFromData((LengthData *)
                                CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),f);
    lengthValueFromData((LengthData *)CONCAT44(in_stack_fffffffffffffee4,iVar2),f);
    QSize::QSize(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
    QList<QVariant>::~QList((QList<QVariant> *)0xa2ef0b);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_90;
  }
  __stack_chk_fail();
}

Assistant:

QSize ValueExtractor::sizeValue(const Declaration &decl)
{
    if (decl.d->parsed.isValid()) {
        QList<QVariant> v = decl.d->parsed.toList();
        return QSize(lengthValueFromData(qvariant_cast<LengthData>(v.at(0)), f),
                     lengthValueFromData(qvariant_cast<LengthData>(v.at(1)), f));
    }

    LengthData x[2] = { {0, LengthData::None }, {0, LengthData::None} };
    if (decl.d->values.size() > 0)
        x[0] = lengthValue(decl.d->values.at(0));
    if (decl.d->values.size() > 1)
        x[1] = lengthValue(decl.d->values.at(1));
    else
        x[1] = x[0];
    QList<QVariant> v;
    v << QVariant::fromValue<LengthData>(x[0]) << QVariant::fromValue<LengthData>(x[1]);
    decl.d->parsed = v;
    return QSize(lengthValueFromData(x[0], f), lengthValueFromData(x[1], f));
}